

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O1

double __thiscall
calculator::ExpressionTree::calcFunctionValue(ExpressionTree *this,node *x,string *function)

{
  iterator iVar1;
  FunctionDeclareException *this_00;
  undefined8 uVar2;
  pointer_____offset_0x10___ *ppuVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double local_20;
  
  if (x == (node *)0x0) {
    this_00 = (FunctionDeclareException *)__cxa_allocate_exception(0x28);
    UnaryFunctionException::UnaryFunctionException((UnaryFunctionException *)this_00,function);
    ppuVar3 = &UnaryFunctionException::typeinfo;
  }
  else {
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->lexer_).unary_functions._M_h,function);
    dVar4 = extraout_XMM0_Qa;
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_20 = x->value;
      if (*(long *)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
                          ._M_cur + 0x38) == 0) {
        uVar2 = std::__throw_bad_function_call();
        __cxa_free_exception
                  (iVar1.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
                   ._M_cur);
        _Unwind_Resume(uVar2);
      }
      dVar4 = (double)(**(code **)((long)iVar1.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
                                         ._M_cur + 0x40))
                                ((long)iVar1.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
                                       ._M_cur + 0x28,&local_20);
    }
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      return dVar4;
    }
    this_00 = (FunctionDeclareException *)__cxa_allocate_exception(0x28);
    FunctionDeclareException::FunctionDeclareException(this_00,function);
    ppuVar3 = &FunctionDeclareException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar3,SyntaxError::~SyntaxError);
}

Assistant:

double ExpressionTree::calcFunctionValue(node *x, std::string function) {
    if (x == nullptr) throw UnaryFunctionException(function);
    if (auto it = lexer_.unary_functions.find(function);
        it != lexer_.unary_functions.end()) {
        return it->second(x->value);
    }
    throw FunctionDeclareException(function);
}